

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  char netrcbuffer [4096];
  
  pcVar1 = *loginp;
  pcVar2 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    iVar4 = 1;
  }
  else {
    uVar9 = 0;
    iVar4 = 1;
    bVar3 = false;
LAB_00579ec5:
    if ((!bVar3) &&
       (pcVar5 = Curl_get_line(netrcbuffer,0x1000,(FILE *)__stream), pcVar5 != (char *)0x0)) {
      uVar8 = (uint)uVar9;
      if (uVar8 == 3) goto code_r0x00579eef;
      goto LAB_00579f03;
    }
LAB_0057a2df:
    fclose(__stream);
  }
  return iVar4;
code_r0x00579eef:
  bVar3 = false;
  uVar8 = 0;
  if ((netrcbuffer[0] == '\r') || (uVar9 = 3, netrcbuffer[0] == '\n')) {
LAB_00579f03:
    uVar9 = (ulong)uVar8;
    for (pcVar5 = netrcbuffer; (cVar7 = *pcVar5, cVar7 == '\t' || (cVar7 == ' '));
        pcVar5 = pcVar5 + 1) {
    }
    if ((cVar7 == '\0') || (cVar7 == '#')) {
      bVar3 = false;
    }
    else {
      if (cVar7 == '\"') {
        pcVar10 = pcVar5;
        bVar3 = false;
LAB_00579f49:
        bVar6 = bVar3;
        pcVar10 = pcVar10 + 1;
        cVar7 = *pcVar10;
        if (cVar7 != '\0') {
          if (!bVar6) goto code_r0x00579f60;
          if (cVar7 == 't') {
            cVar7 = '\t';
          }
          else if (cVar7 == 'r') {
            cVar7 = '\r';
          }
          else if (cVar7 == 'n') {
            cVar7 = '\n';
          }
          bVar6 = false;
          goto LAB_00579f91;
        }
        *pcVar5 = '\0';
        iVar4 = -1;
        goto LAB_0057a2df;
      }
      while (((cVar7 != '\t' && (cVar7 != ' ')) && ((byte)(cVar7 - 0xeU) < 0xfc))) {
        pcVar10 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        cVar7 = *pcVar10;
      }
LAB_00579fb9:
      *pcVar5 = '\0';
      if (((pcVar1 == (char *)0x0) || (pcVar2 == (char *)0x0 || *pcVar1 == '\0')) ||
         (*pcVar2 == '\0')) {
        iVar4 = (*(code *)(&DAT_00783b90 + *(int *)(&DAT_00783b90 + uVar9 * 4)))();
        return iVar4;
      }
      bVar3 = true;
    }
  }
  goto LAB_00579ec5;
code_r0x00579f60:
  bVar3 = true;
  if (cVar7 != '\\') {
    if (cVar7 != '\"') {
LAB_00579f91:
      *pcVar5 = cVar7;
      pcVar5 = pcVar5 + 1;
      bVar3 = bVar6;
      goto LAB_00579f49;
    }
    goto LAB_00579fb9;
  }
  goto LAB_00579f49;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = TRUE;  /* With specific_login, found *our* login
                                  name (or login-less line) */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && Curl_get_line(netrcbuffer, netrcbuffsize, file)) {
      char *tok;
      char *tok_end;
      bool quoted;
      if(state == MACDEF) {
        if((netrcbuffer[0] == '\n') || (netrcbuffer[0] == '\r'))
          state = NOTHING;
        else
          continue;
      }
      tok = netrcbuffer;
      while(tok) {
        while(ISBLANK(*tok))
          tok++;
        /* tok is first non-space letter */
        if(!*tok || (*tok == '#'))
          /* end of line or the rest is a comment */
          break;

        /* leading double-quote means quoted string */
        quoted = (*tok == '\"');

        tok_end = tok;
        if(!quoted) {
          while(!ISSPACE(*tok_end))
            tok_end++;
          *tok_end = 0;
        }
        else {
          bool escape = FALSE;
          bool endquote = FALSE;
          char *store = tok;
          tok_end++; /* pass the leading quote */
          while(*tok_end) {
            char s = *tok_end;
            if(escape) {
              escape = FALSE;
              switch(s) {
              case 'n':
                s = '\n';
                break;
              case 'r':
                s = '\r';
                break;
              case 't':
                s = '\t';
                break;
              }
            }
            else if(s == '\\') {
              escape = TRUE;
              tok_end++;
              continue;
            }
            else if(s == '\"') {
              tok_end++; /* pass the ending quote */
              endquote = TRUE;
              break;
            }
            *store++ = s;
            tok_end++;
          }
          *store = 0;
          if(escape || !endquote) {
            /* bad syntax, get out */
            retcode = NETRC_FAILED;
            goto out;
          }
        }

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("macdef", tok)) {
            /* Define a macro. A macro is defined with the specified name; its
               contents begin with the next .netrc line and continue until a
               null line (consecutive new-line characters) is encountered. */
            state = MACDEF;
          }
          else if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case MACDEF:
          if(!strlen(tok)) {
            state = NOTHING;
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = !Curl_timestrcmp(login, tok);
            }
            else if(!login || Curl_timestrcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
               && (!password || Curl_timestrcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */
        tok = ++tok_end;
      }
    } /* while Curl_get_line() */

out:
    if(!retcode) {
      /* success */
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}